

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void legendre_associated(int n,int m,double x,double *cx)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  if (m < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of M is ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,m);
    std::operator<<(poVar4,"\n");
    pcVar6 = "  but M must be nonnegative.\n";
  }
  else if (n < m) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of M = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,m);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of N = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,n);
    std::operator<<(poVar4,"\n");
    pcVar6 = "  but M must be less than or equal to N.\n";
  }
  else if (x < -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,x);
    std::operator<<(poVar4,"\n");
    pcVar6 = "  but X must be no less than -1.\n";
  }
  else {
    if (x <= 1.0) {
      uVar7 = (ulong)(uint)m;
      for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
        cx[uVar3] = 0.0;
      }
      cx[uVar7] = 1.0;
      dVar9 = 1.0 - x * x;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar10 = 1.0;
      iVar1 = m;
      while (bVar8 = iVar1 != 0, iVar1 = iVar1 + -1, bVar8) {
        cx[uVar7] = -cx[uVar7] * dVar10 * dVar9;
        dVar10 = dVar10 + 2.0;
      }
      if (m != n) {
        cx[uVar7 + 1] = (double)(m * 2 + 1) * x * cx[uVar7];
        uVar2 = ~(m * 2);
        iVar1 = m * 2 + 3;
        iVar5 = 2;
        for (uVar3 = (ulong)(m + 2); (int)uVar3 <= n; uVar3 = uVar3 + 1) {
          cx[uVar3] = ((double)iVar1 * x * cx[uVar3 - 1] + (double)(int)uVar2 * cx[uVar3 - 2]) /
                      (double)iVar5;
          uVar2 = uVar2 - 1;
          iVar1 = iVar1 + 2;
          iVar5 = iVar5 + 1;
        }
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,x);
    std::operator<<(poVar4,"\n");
    pcVar6 = "  but X must be no more than 1.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar6);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void legendre_associated ( int n, int m, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED evaluates the associated Legendre functions.
//
//  Differential equation:
//
//    (1-X*X) * Y'' - 2 * X * Y + ( N (N+1) - (M*M/(1-X*X)) * Y = 0
//
//  First terms:
//
//    M = 0  ( = Legendre polynomials of first kind P(N,X) )
//
//    P00 =    1
//    P10 =    1 X
//    P20 = (  3 X^2 -   1)/2
//    P30 = (  5 X^3 -   3 X)/2
//    P40 = ( 35 X^4 -  30 X^2 +   3)/8
//    P50 = ( 63 X^5 -  70 X^3 +  15 X)/8
//    P60 = (231 X^6 - 315 X^4 + 105 X^2 -  5)/16
//    P70 = (429 X^7 - 693 X^5 + 315 X^3 - 35 X)/16
//
//    M = 1
//
//    P01 =   0
//    P11 =   1 * SQRT(1-X*X)
//    P21 =   3 * SQRT(1-X*X) * X
//    P31 = 1.5 * SQRT(1-X*X) * (5*X*X-1)
//    P41 = 2.5 * SQRT(1-X*X) * (7*X*X*X-3*X)
//
//    M = 2
//
//    P02 =   0
//    P12 =   0
//    P22 =   3 * (1-X*X)
//    P32 =  15 * (1-X*X) * X
//    P42 = 7.5 * (1-X*X) * (7*X*X-1)
//
//    M = 3
//
//    P03 =   0
//    P13 =   0
//    P23 =   0
//    P33 =  15 * (1-X*X)^1.5
//    P43 = 105 * (1-X*X)^1.5 * X
//
//    M = 4
//
//    P04 =   0
//    P14 =   0
//    P24 =   0
//    P34 =   0
//    P44 = 105 * (1-X*X)^2
//
//  Recursion:
//
//    if N < M:
//      P(N,M) = 0
//    if N = M:
//      P(N,M) = (2*M-1)!! * (1-X*X)^(M/2) where N!! means the product of
//      all the odd integers less than or equal to N.
//    if N = M+1:
//      P(N,M) = X*(2*M+1)*P(M,M)
//    if M+1 < N:
//      P(N,M) = ( X*(2*N-1)*P(N-1,M) - (N+M-1)*P(N-2,M) )/(N-M)
//
//  Special values:
//
//    P(N,0,X) = P(N,X), that is, for M=0, the associated Legendre
//    function of the first kind equals the Legendre polynomial of the
//    first kind.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the maximum first index of the Legendre
//    function, which must be at least 0.
//
//    Input, int M, the second index of the Legendre function,
//    which must be at least 0, and no greater than N.
//
//    Input, double X, the point at which the function is to be
//    evaluated.  X must satisfy -1 <= X <= 1.
//
//    Output, double CX[N+1], the values of the first N+1 function.
//
{
  double factor;
  int i;
  double somx2;

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of M is " << m << "\n";
    std::cerr << "  but M must be nonnegative.\n";
    exit ( 1 );
  }

  if ( n < m )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of M = " << m << "\n";
    std::cerr << "  Input value of N = " << n << "\n";
    std::cerr << "  but M must be less than or equal to N.\n";
    exit ( 1 );
  }

  if ( x < -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no less than -1.\n";
    exit ( 1 );
  }

  if ( 1.0 < x )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no more than 1.\n";
    exit ( 1 );
  }

  for ( i = 0; i <= m-1; i++ )
  {
    cx[i] = 0.0;
  }
  cx[m] = 1.0;

  somx2 = sqrt ( 1.0 - x * x );

  factor = 1.0;
  for ( i = 1; i <= m; i++ )
  {
    cx[m] = -cx[m] * factor * somx2;
    factor = factor + 2.0;
  }

  if ( m == n )
  {
    return;
  }

  cx[m+1] = x * double( 2 * m + 1 ) * cx[m];

  for ( i = m+2; i <= n; i++ )
  {
    cx[i] = ( double( 2 * i     - 1 ) * x * cx[i-1] 
            + double(   - i - m + 1 )     * cx[i-2] ) 
            / double(     i - m     );
  }

  return;
}